

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void non_existing_opendir_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req == &opendir_req) {
    if (opendir_req.fs_type == UV_FS_OPENDIR) {
      if (opendir_req.result == -2) {
        if (opendir_req.ptr == (void *)0x0) {
          uv_fs_req_cleanup(&opendir_req);
          non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
          return;
        }
        pcVar2 = "req->ptr == NULL";
        uVar1 = 0xae;
      }
      else {
        pcVar2 = "req->result == UV_ENOENT";
        uVar1 = 0xad;
      }
    }
    else {
      pcVar2 = "req->fs_type == UV_FS_OPENDIR";
      uVar1 = 0xac;
    }
  }
  else {
    pcVar2 = "req == &opendir_req";
    uVar1 = 0xab;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void non_existing_opendir_cb(uv_fs_t* req) {
  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == UV_ENOENT);
  ASSERT(req->ptr == NULL);

  uv_fs_req_cleanup(req);
  ++non_existing_opendir_cb_count;
}